

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storing.c
# Opt level: O0

int store_all_transfers_db(FILE *fp,feed_db_t *db)

{
  int iVar1;
  int iVar2;
  int local_d0;
  int i;
  int field_count;
  char **field_names;
  int record_count;
  int lines_count;
  char **record_values;
  undefined1 local_a8 [4];
  feed_db_status_t res;
  transfer_t record;
  feed_db_t *db_local;
  FILE *fp_local;
  
  _record_count = (char **)0x0;
  record._128_8_ = db;
  iVar1 = count_lines(fp);
  field_names._4_4_ = iVar1 + -1;
  field_names._0_4_ = 0;
  _i = (char **)0x0;
  iVar1 = read_header(fp,(char ***)&i);
  if (iVar1 < 0) {
    free_cstr_arr(_i,(long)iVar1);
    fp_local._4_4_ = -1;
  }
  else if (field_names._4_4_ < 1) {
    free_cstr_arr(_i,(long)iVar1);
    free(_record_count);
    fp_local._4_4_ = 0;
    if (field_names._4_4_ < 0) {
      fp_local._4_4_ = -1;
    }
  }
  else {
    record_values._4_4_ = begin_transaction_db((feed_db_t *)record._128_8_);
    if (record_values._4_4_ == FEED_DB_ERROR) {
      free_cstr_arr(_i,(long)iVar1);
      fp_local._4_4_ = -1;
    }
    else {
      for (local_d0 = 0; local_d0 < field_names._4_4_; local_d0 = local_d0 + 1) {
        iVar2 = read_record(fp,iVar1,(char ***)&record_count);
        if (0 < iVar2) {
          read_transfer((transfer_t *)local_a8,iVar1,_i,_record_count);
          record_values._4_4_ =
               store_transfer_db((transfer_t *)local_a8,(feed_db_t *)record._128_8_);
          if (record_values._4_4_ != FEED_DB_SUCCESS) break;
          field_names._0_4_ = (int)field_names + 1;
        }
        free_cstr_arr(_record_count,(long)iVar1);
      }
      end_transaction_db((feed_db_t *)record._128_8_);
      free_cstr_arr(_i,(long)iVar1);
      fp_local._4_4_ = (int)field_names;
    }
  }
  return fp_local._4_4_;
}

Assistant:

int store_all_transfers_db(FILE *fp, feed_db_t *db) {

    transfer_t record;
    feed_db_status_t res;

    char **record_values = NULL;
    int lines_count = count_lines(fp) - 1;
    int record_count = 0;

    char **field_names = NULL;
    int field_count = read_header(fp, &field_names);

    if (field_count < 0) {
        free_cstr_arr(field_names, field_count);
        return -1;
    }

    if (lines_count < 1) {
        free_cstr_arr(field_names, field_count);
        free(record_values);
        return (lines_count < 0) ? -1 : 0;
    }

    #ifndef CGTFS_STORING_BATCH_TRANSACTIONS_OFF
    if ((res = begin_transaction_db(db)) == FEED_DB_ERROR) {
        free_cstr_arr(field_names, field_count);
        return -1;
    }
    #endif

    for (int i = 0; i < lines_count; i++) {
        if (read_record(fp, field_count, &record_values) > 0) {
            read_transfer(&record, field_count, (const char **)field_names, (const char **)record_values);
            res = store_transfer_db(&record, db);

            // free_cstr_arr(record_values, field_count);

            if (res == FEED_DB_SUCCESS)
                record_count++;
            else
                break;
        }
        free_cstr_arr(record_values, field_count);
    }

    #ifndef CGTFS_STORING_BATCH_TRANSACTIONS_OFF
    end_transaction_db(db);
    #endif

    free_cstr_arr(field_names, field_count);
    return record_count;
}